

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O0

Node * __thiscall BinarySearchTree::findMin(BinarySearchTree *this,Node *node)

{
  Node *node_local;
  BinarySearchTree *this_local;
  
  if (node == (Node *)0x0) {
    this_local = (BinarySearchTree *)0x0;
  }
  else {
    this_local = (BinarySearchTree *)node;
    if (node->leftChild != (Node *)0x0) {
      this_local = (BinarySearchTree *)findMin(this,node->leftChild);
    }
  }
  return (Node *)this_local;
}

Assistant:

BinarySearchTree::Node *BinarySearchTree::findMin(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->leftChild == nullptr) {
        return node;
    } else {
        return findMin(node->leftChild);
    }
}